

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArraySubImage3D::configureCubeMapArrayTexture
          (TextureCubeMapArraySubImage3D *this,GLuint width,GLuint height,GLuint depth,
          STORAGE_TYPE storType,GLuint clear_value)

{
  GLuint GVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  allocator_type local_51;
  GLuint local_50;
  GLuint clear_value_local;
  DataBufferVec data_buffer;
  long lVar4;
  
  local_50 = depth;
  clear_value_local = clear_value;
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x6f8))(1,&this->m_tex_cube_map_array_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                  ,0x141);
  (**(code **)(lVar4 + 0xb8))(0x9009,this->m_tex_cube_map_array_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                  ,0x144);
  GVar1 = local_50;
  if (storType != ST_MUTABLE) {
    (**(code **)(lVar4 + 0x1398))(0x9009,1,0x8d70,width,height,local_50);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Error allocating texture object\'s data store",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                    ,0x158);
    clearCubeMapArrayTexture(this,width,height,GVar1,clear_value_local);
    return;
  }
  (**(code **)(lVar4 + 0x1360))(0x9009,0x813c,0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error setting texture parameter.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                  ,0x14a);
  (**(code **)(lVar4 + 0x1360))(0x9009,0x813d,0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error setting texture parameter.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                  ,0x14c);
  GVar1 = local_50;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&data_buffer,(ulong)(width * height * local_50 * 4),&clear_value_local,&local_51);
  (**(code **)(lVar4 + 0x1320))
            (0x9009,0,0x8d70,width,height,GVar1,0,0x8d99,0x1405,
             data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error allocating texture object\'s data store",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                  ,0x152);
  if (data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)data_buffer.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)data_buffer.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TextureCubeMapArraySubImage3D::configureCubeMapArrayTexture(glw::GLuint width, glw::GLuint height,
																 glw::GLuint depth, STORAGE_TYPE storType,
																 glw::GLuint clear_value)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genTextures(1, &m_tex_cube_map_array_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");

	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_tex_cube_map_array_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	/* used glTexImage3D() method if texture should be MUTABLE */
	if (storType == ST_MUTABLE)
	{
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_BASE_LEVEL, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture parameter.");
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAX_LEVEL, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture parameter.");

		DataBufferVec data_buffer(width * height * depth * m_n_components, clear_value);

		gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, GL_RGBA32UI, width, height, depth, 0, GL_RGBA_INTEGER,
					  GL_UNSIGNED_INT, &data_buffer[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating texture object's data store");
	}
	/* used glTexStorage3D() method if texture should be IMMUTABLE */
	else
	{
		gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 1, GL_RGBA32UI, width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating texture object's data store");

		clearCubeMapArrayTexture(width, height, depth, clear_value);
	}
}